

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_string.c
# Opt level: O3

void d_string_append_c_array(DString *baseString,char *appendedChars,size_t bytes)

{
  size_t newStringSize;
  
  if (appendedChars != (char *)0x0 && baseString != (DString *)0x0) {
    if (bytes == 0xffffffffffffffff) {
      d_string_append(baseString,appendedChars);
      return;
    }
    newStringSize = baseString->currentStringLength + bytes;
    ensureStringBufferCanHold(baseString,newStringSize);
    memcpy(baseString->str + baseString->currentStringLength,appendedChars,bytes);
    baseString->currentStringLength = newStringSize;
    baseString->str[newStringSize] = '\0';
  }
  return;
}

Assistant:

void d_string_append_c_array(DString * baseString, const char * appendedChars, size_t bytes) {
	if (baseString && appendedChars) {
		if (bytes == -1) {
			// This is the same as regular append
			d_string_append(baseString, appendedChars);
		} else {
			if (appendedChars) {
				size_t newSizeNeeded = baseString->currentStringLength + bytes;
				ensureStringBufferCanHold(baseString, newSizeNeeded);

				memcpy((void *)baseString->str + baseString->currentStringLength, appendedChars, bytes);

				baseString->currentStringLength = newSizeNeeded;
				baseString->str[newSizeNeeded] = '\0';
			}
		}
	}
}